

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void fs_write_alotof_bufs(int add_flags)

{
  uv_buf_t uVar1;
  uv_buf_t uVar2;
  uv_buf_t uVar3;
  uv_buf_t uVar4;
  uv_buf_t uVar5;
  int iVar6;
  void *__ptr;
  void *__ptr_00;
  __off64_t _Var7;
  undefined8 uVar8;
  char *pcVar9;
  long lVar10;
  void *pvVar11;
  undefined1 auVar12 [16];
  
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  __ptr = malloc(0xd4310);
  if (__ptr == (void *)0x0) {
    pcVar9 = "iovs";
    uVar8 = 0xd08;
LAB_0012b8fa:
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            uVar8,pcVar9,"!=","NULL",0,"!=",0);
    abort();
  }
  iVar6 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
  uVar5.len = iov.len;
  uVar5.base = iov.base;
  if (iVar6 < 0) {
    pcVar9 = "r >= 0";
    uVar8 = 0xd11;
  }
  else if (open_req1.result._4_4_ < 0) {
    pcVar9 = "open_req1.result >= 0";
    uVar8 = 0xd12;
    iov = uVar5;
  }
  else {
    uv_fs_req_cleanup(&open_req1);
    for (lVar10 = 8; lVar10 != 0xd4318; lVar10 = lVar10 + 0x10) {
      auVar12 = uv_buf_init(test_buf,0xd);
      *(long *)((long)__ptr + lVar10 + -8) = auVar12._0_8_;
      *(long *)((long)__ptr + lVar10) = auVar12._8_8_;
    }
    iVar6 = uv_fs_write(0,&write_req,(int)open_req1.result,__ptr,0xd431,0xffffffffffffffff,0);
    uVar4.len = iov.len;
    uVar4.base = iov.base;
    if (iVar6 < 0) {
      pcVar9 = "r >= 0";
      uVar8 = 0xd1f;
    }
    else if (write_req.result == 0xac67d) {
      uv_fs_req_cleanup(&write_req);
      __ptr_00 = malloc(0xac67d);
      if (__ptr_00 == (void *)0x0) {
        pcVar9 = "buffer";
        uVar8 = 0xd25;
        goto LAB_0012b8fa;
      }
      pvVar11 = __ptr_00;
      for (lVar10 = 8; lVar10 != 0xd4318; lVar10 = lVar10 + 0x10) {
        auVar12 = uv_buf_init(pvVar11,0xd);
        *(long *)((long)__ptr + lVar10 + -8) = auVar12._0_8_;
        *(long *)((long)__ptr + lVar10) = auVar12._8_8_;
        pvVar11 = (void *)((long)pvVar11 + 0xd);
      }
      iVar6 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      uVar3.len = iov.len;
      uVar3.base = iov.base;
      if (iVar6 == 0) {
        if (close_req.result == 0) {
          uv_fs_req_cleanup(&close_req);
          iVar6 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
          uVar2.len = iov.len;
          uVar2.base = iov.base;
          if (iVar6 < 0) {
            pcVar9 = "r >= 0";
            uVar8 = 0xd32;
          }
          else if (open_req1.result._4_4_ < 0) {
            pcVar9 = "open_req1.result >= 0";
            uVar8 = 0xd33;
            iov = uVar2;
          }
          else {
            uv_fs_req_cleanup();
            iVar6 = uv_fs_read(0,&read_req,(int)open_req1.result,__ptr,0xd431,0xffffffffffffffff,0);
            uVar1.len = iov.len;
            uVar1.base = iov.base;
            if (iVar6 < 0) {
              pcVar9 = "r >= 0";
              uVar8 = 0xd39;
            }
            else if (read_req.result == 0x3400) {
              lVar10 = 0;
              do {
                if (lVar10 + 0xd == 0x340d) {
                  uv_fs_req_cleanup(&read_req);
                  free(__ptr_00);
                  _Var7 = lseek64((int)open_req1.result,write_req.result,0);
                  if (_Var7 == write_req.result) {
                    iov = (uv_buf_t)uv_buf_init(buf,0x20);
                    iVar6 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff,0
                                      );
                    if (iVar6 == 0) {
                      if (read_req.result == 0) {
                        uv_fs_req_cleanup(&read_req);
                        iVar6 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
                        if (iVar6 == 0) {
                          if (close_req.result == 0) {
                            uv_fs_req_cleanup(&close_req);
                            unlink("test_file");
                            free(__ptr);
                            return;
                          }
                          pcVar9 = "close_req.result == 0";
                          uVar8 = 0xd53;
                        }
                        else {
                          pcVar9 = "r == 0";
                          uVar8 = 0xd52;
                        }
                      }
                      else {
                        pcVar9 = "read_req.result == 0";
                        uVar8 = 0xd4e;
                      }
                    }
                    else {
                      pcVar9 = "r == 0";
                      uVar8 = 0xd4d;
                    }
                  }
                  else {
                    pcVar9 = 
                    "lseek(open_req1.result, write_req.result, SEEK_SET) == write_req.result";
                    uVar8 = 0xd44;
                  }
                  goto LAB_0012b6c1;
                }
                iVar6 = strncmp((char *)(lVar10 + (long)__ptr_00),test_buf,0xd);
                lVar10 = lVar10 + 0xd;
              } while (iVar6 == 0);
              pcVar9 = "strncmp(buffer + index * sizeof(test_buf), test_buf, sizeof(test_buf)) == 0"
              ;
              uVar8 = 0xd3f;
            }
            else {
              pcVar9 = "(size_t)read_req.result == sizeof(test_buf) * iovcount";
              uVar8 = 0xd3a;
              iov = uVar1;
            }
          }
        }
        else {
          pcVar9 = "close_req.result == 0";
          uVar8 = 0xd2d;
          iov = uVar3;
        }
      }
      else {
        pcVar9 = "r == 0";
        uVar8 = 0xd2c;
      }
    }
    else {
      pcVar9 = "(size_t)write_req.result == sizeof(test_buf) * iovcount";
      uVar8 = 0xd20;
      iov = uVar4;
    }
  }
LAB_0012b6c1:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar8,pcVar9);
  abort();
}

Assistant:

static void fs_write_alotof_bufs(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;

  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT_NOT_NULL(iovs);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  -1,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT_NOT_NULL(buffer);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags, 0,
    NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  r = uv_fs_read(NULL, &read_req, open_req1.result, iovs, iovcount, -1, NULL);
  if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT(r >= 0);
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  ASSERT(lseek(open_req1.result, write_req.result, SEEK_SET) == write_req.result);
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 -1,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}